

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O2

Type * __thiscall
slang::ast::builtins::FinishControlTask::checkArguments
          (FinishControlTask *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_4)

{
  Compilation *pCVar1;
  bool bVar2;
  long lVar3;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar2 = SystemSubroutine::checkArgCount((SystemSubroutine *)this,context,false,args,range,0,1);
  lVar3 = 400;
  if (bVar2) {
    if ((args->_M_extent)._M_extent_value == 1) {
      bVar2 = FmtHelpers::checkFinishNum(context,*args->_M_ptr);
      if (!bVar2) goto LAB_0031d37c;
    }
    lVar3 = 0x188;
  }
LAB_0031d37c:
  return *(Type **)((long)&(pCVar1->super_BumpAllocator).head + lVar3);
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 0, 1))
            return comp.getErrorType();

        if (args.size() == 1) {
            if (!FmtHelpers::checkFinishNum(context, *args[0]))
                return comp.getErrorType();
        }

        return comp.getVoidType();
    }